

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsettingsd.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  size_type sVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string config_file;
  SettingsManager manager;
  option options [4];
  int local_17c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string local_160;
  long local_140;
  SettingsManager local_138;
  undefined8 local_b8 [17];
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  puVar6 = &DAT_0010bb20;
  puVar7 = local_b8;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    puVar7 = puVar7 + 1;
  }
  _opterr = 0;
  lVar5 = 0xffffffff;
  local_17c = 0;
  do {
    iVar4 = getopt_long(argc,argv,"c:hs:",local_b8,0);
    sVar3 = local_160._M_string_length;
    pcVar2 = _optarg;
    if (iVar4 < 99) {
      iVar8 = 3;
      if (iVar4 != -1) {
        if (iVar4 != 0x3f) goto LAB_001038b9;
LAB_0010384b:
        main_cold_1();
LAB_00103850:
        local_17c = 1;
        iVar8 = 1;
      }
    }
    else if (iVar4 == 99) {
      local_140 = lVar5;
      strlen(_optarg);
      lVar5 = local_140;
      iVar8 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)sVar3,(ulong)pcVar2);
    }
    else if (iVar4 == 0x73) {
      local_138.config_filename_._M_dataplus._M_p = (pointer)0x0;
      lVar5 = strtol(_optarg,(char **)&local_138,10);
      if (((*_optarg == '\0') || (*local_138.config_filename_._M_dataplus._M_p != '\0')) ||
         (iVar8 = 0, (int)lVar5 < 0)) {
        fprintf(_stderr,"Invalid screen \"%s\"\n");
        goto LAB_00103850;
      }
    }
    else {
      if (iVar4 == 0x68) goto LAB_0010384b;
LAB_001038b9:
      iVar8 = 0;
    }
  } while (iVar8 == 0);
  if (iVar8 != 3) goto LAB_00103a3d;
  if ((char *)local_160._M_string_length == (char *)0x0) {
    xsettingsd::GetDefaultConfigFilePaths_abi_cxx11_();
    bVar11 = local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
LAB_00103980:
      local_138.config_filename_._M_dataplus._M_p = (pointer)&local_138.config_filename_.field_2;
      local_138.config_filename_._M_string_length = 0;
      local_138.config_filename_.field_2._M_local_buf[0] = '\0';
    }
    else {
      iVar4 = access(((local_178.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,4);
      if (iVar4 == 0) {
        uVar9 = 0;
      }
      else {
        lVar10 = 0x20;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + 1;
          bVar11 = uVar9 < (ulong)((long)local_178.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_178.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
          if (!bVar11) goto LAB_00103980;
          iVar4 = access(*(char **)((long)&((local_178.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar10),4);
          lVar10 = lVar10 + 0x20;
        } while (iVar4 != 0);
      }
      local_138.config_filename_._M_dataplus._M_p = (pointer)&local_138.config_filename_.field_2;
      pcVar1 = local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,pcVar1,
                 pcVar1 + local_178.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_string_length);
      if (!bVar11) goto LAB_00103980;
    }
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.config_filename_._M_dataplus._M_p != &local_138.config_filename_.field_2) {
      operator_delete(local_138.config_filename_._M_dataplus._M_p,
                      CONCAT71(local_138.config_filename_.field_2._M_allocated_capacity._1_7_,
                               local_138.config_filename_.field_2._M_local_buf[0]) + 1);
    }
    sVar3 = local_160._M_string_length;
    if ((char *)local_160._M_string_length == (char *)0x0) {
      main_cold_2();
      local_17c = (int)local_138.config_filename_._M_dataplus._M_p;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    if ((char *)sVar3 == (char *)0x0) goto LAB_00103a3d;
  }
  xsettingsd::SettingsManager::SettingsManager(&local_138,&local_160);
  bVar11 = xsettingsd::SettingsManager::LoadConfig(&local_138);
  local_17c = 1;
  if ((bVar11) &&
     (bVar11 = xsettingsd::SettingsManager::InitX11(&local_138,(int)lVar5,true), bVar11)) {
    signal(1,anon_unknown.dwarf_2fb2::HandleSignal);
    local_17c = 0;
    xsettingsd::SettingsManager::RunEventLoop(&local_138);
  }
  xsettingsd::SettingsManager::~SettingsManager(&local_138);
LAB_00103a3d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,
                    CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                             local_160.field_2._M_local_buf[0]) + 1);
  }
  return local_17c;
}

Assistant:

int main(int argc, char** argv) {
  static const char* kUsage =
      "Usage: xsettingsd [OPTION] ...\n"
      "\n"
      "Daemon implementing the XSETTINGS spec to control settings for X11\n"
      "applications.\n"
      "\n"
      "Options: -c, --config=FILE    config file (default is ~/.xsettingsd)\n"
      "         -h, --help           print this help message\n"
      "         -s, --screen=SCREEN  screen to use (default is all)\n";

  int screen = -1;
  string config_file;

  struct option options[] = {
    { "config", 1, NULL, 'c', },
    { "help", 0, NULL, 'h', },
    { "screen", 1, NULL, 's', },
    { NULL, 0, NULL, 0 },
  };

  opterr = 0;
  while (true) {
    int ch = getopt_long(argc, argv, "c:hs:", options, NULL);
    if (ch == -1) {
      break;
    } else if (ch == 'c') {
      config_file = optarg;
    } else if (ch == 'h' || ch == '?') {
      fprintf(stderr, "%s", kUsage);
      return 1;
    } else if (ch == 's') {
      char* endptr = NULL;
      screen = strtol(optarg, &endptr, 10);
      if (optarg[0] == '\0' || endptr[0] != '\0' || screen < 0) {
        fprintf(stderr, "Invalid screen \"%s\"\n", optarg);
        return 1;
      }
    }
  }

  // Check default config file locations if one wasn't supplied via a flag.
  if (config_file.empty()) {
    const vector<string> paths = xsettingsd::GetDefaultConfigFilePaths();
    config_file = GetFirstReadablePath(paths);
    if (config_file.empty()) {
      fprintf(stderr, "%s: Couldn't find config file. Tried the following:\n",
              xsettingsd::kProgName);
      for (size_t i = 0; i < paths.size(); ++i)
        fprintf(stderr, "  %s\n", paths[i].c_str());
      return 1;
    }
  }

  xsettingsd::SettingsManager manager(config_file);
  if (!manager.LoadConfig())
    return 1;
  if (!manager.InitX11(screen, true))
    return 1;

  signal(SIGHUP, HandleSignal);

  manager.RunEventLoop();
  return 0;
}